

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O3

word * If_DsdManGetFuncConfig(If_DsdMan_t *p,int iDsd)

{
  Vec_Wrd_t *pVVar1;
  word *pwVar2;
  uint uVar3;
  
  pVVar1 = p->vConfigs;
  if (pVVar1 == (Vec_Wrd_t *)0x0) {
    pwVar2 = (word *)0x0;
  }
  else {
    if (iDsd < 0) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x12f,"int Abc_Lit2Var(int)");
    }
    uVar3 = ((uint)iDsd >> 1) * p->nConfigWords;
    if (((int)uVar3 < 0) || (pVVar1->nSize <= (int)uVar3)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                    ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
    }
    pwVar2 = pVVar1->pArray + uVar3;
  }
  return pwVar2;
}

Assistant:

word * If_DsdManGetFuncConfig( If_DsdMan_t * p, int iDsd )
{
    return p->vConfigs ? Vec_WrdEntryP(p->vConfigs, p->nConfigWords * Abc_Lit2Var(iDsd)) : NULL;
}